

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieGia.c
# Opt level: O3

Gia_Man_t * Gia_ManSweepHierarchy(Gia_Man_t *p)

{
  int nObjsMax;
  uint uVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  ulong uVar4;
  Gia_Obj_t *pGVar5;
  uint uVar6;
  int iVar7;
  Gia_Man_t *p_00;
  size_t sVar8;
  char *pcVar9;
  Gia_Obj_t *pGVar10;
  Gia_Man_t *pGVar11;
  uint uVar12;
  Gia_Obj_t *pObjBuf;
  long lVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  void *local_40;
  
  nObjsMax = p->nObjs;
  iVar7 = 0x10;
  if (0xe < nObjsMax - 1U) {
    iVar7 = nObjsMax;
  }
  if ((iVar7 == 0) || (local_40 = malloc((long)iVar7 << 2), local_40 == (void *)0x0)) {
    local_40 = (void *)0x0;
  }
  else {
    memset(local_40,0,(long)nObjsMax * 4);
  }
  p_00 = Gia_ManStart(nObjsMax);
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar2);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar2);
  }
  p_00->pName = pcVar9;
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar2);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar2);
  }
  p_00->pSpec = pcVar9;
  p->pObjs->Value = 0;
  Gia_ManHashAlloc(p_00);
  if (1 < p->nObjs) {
    lVar13 = 1;
    lVar16 = 0x14;
    do {
      pGVar3 = p->pObjs;
      uVar4 = *(ulong *)((long)pGVar3 + lVar16 + -8);
      uVar6 = (uint)uVar4;
      uVar12 = uVar6 & 0x1fffffff;
      uVar14 = (uint)(uVar4 >> 0x20);
      if ((((int)uVar6 < 0) || ((uVar6 & 0x1fffffff) == 0x1fffffff)) ||
         ((uVar6 & 0x1fffffff) != (uVar14 & 0x1fffffff))) {
        if (uVar12 == 0x1fffffff || (int)uVar6 < 0) {
          if ((uVar6 & 0x9fffffff) == 0x9fffffff) {
            pGVar10 = Gia_ManAppendObj(p_00);
            uVar4 = *(ulong *)pGVar10;
            *(ulong *)pGVar10 = uVar4 | 0x9fffffff;
            *(ulong *)pGVar10 =
                 uVar4 & 0xe0000000ffffffff | 0x9fffffff |
                 (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
            pGVar5 = p_00->pObjs;
            if ((pGVar10 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar10)) {
LAB_00858140:
              __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
            }
            Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar10 - (long)pGVar5) >> 2) * -0x55555555);
            pGVar5 = p_00->pObjs;
            if ((pGVar10 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar10)) goto LAB_00858140;
            *(int *)(&pGVar3->field_0x0 + lVar16) =
                 (int)((ulong)((long)pGVar10 - (long)pGVar5) >> 2) * 0x55555556;
          }
          else if ((int)uVar6 < 0 && uVar12 != 0x1fffffff) {
            uVar12 = *(uint *)((long)pGVar3 + lVar16 + (ulong)(uVar12 << 2) * -3);
            if ((int)uVar12 < 0) goto LAB_008580e3;
            iVar7 = Gia_ManAppendCo(p_00,uVar12 ^ uVar6 >> 0x1d & 1);
            goto LAB_00858073;
          }
        }
        else {
          uVar6 = *(uint *)((long)pGVar3 + lVar16 + (ulong)(uVar12 << 2) * -3);
          if (((int)uVar6 < 0) ||
             (uVar12 = *(uint *)((long)pGVar3 + lVar16 + (ulong)((uVar14 & 0x1fffffff) << 2) * -3),
             (int)uVar12 < 0)) goto LAB_008580e3;
          iVar7 = Gia_ManHashAnd(p_00,uVar6 ^ (uint)(uVar4 >> 0x1d) & 1,uVar12 ^ uVar14 >> 0x1d & 1)
          ;
LAB_00858073:
          *(int *)(&pGVar3->field_0x0 + lVar16) = iVar7;
        }
      }
      else {
        uVar12 = *(uint *)((long)pGVar3 + lVar16 + (ulong)(uVar12 << 2) * -3);
        if ((int)uVar12 < 0) {
LAB_008580e3:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        uVar6 = Gia_ManAppendBuf(p_00,uVar12 ^ uVar6 >> 0x1d & 1);
        *(uint *)(&pGVar3->field_0x0 + lVar16) = uVar6;
        if ((int)uVar6 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        uVar12 = uVar6 >> 1;
        if (p_00->nObjs <= (int)uVar12) {
LAB_00858102:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        pGVar5 = p_00->pObjs + uVar12;
        uVar14 = (uint)*(ulong *)pGVar5;
        uVar15 = uVar12 - (uVar14 & 0x1fffffff);
        if (uVar15 == 0) {
          *(uint *)(&pGVar3->field_0x0 + lVar16) = (uint)(*(ulong *)pGVar5 >> 0x1d) & 1;
          uVar4 = *(ulong *)pGVar5;
          if ((((int)(uint)uVar4 < 0) || (uVar14 = (uint)uVar4 & 0x1fffffff, uVar14 == 0x1fffffff))
             || (uVar14 != ((uint)(uVar4 >> 0x20) & 0x1fffffff))) {
LAB_0085815f:
            __assert_fail("Gia_ObjIsBuf(pObjBuf)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieGia.c"
                          ,0x113,"void Gia_ManPatchBufDriver(Gia_Man_t *, int, int)");
          }
          if (uVar6 < 2) {
LAB_0085817e:
            __assert_fail("Gia_ObjId(p, pObjBuf) > Abc_Lit2Var(iLit0)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcHieGia.c"
                          ,0x114,"void Gia_ManPatchBufDriver(Gia_Man_t *, int, int)");
          }
          *(ulong *)pGVar5 = CONCAT44(uVar12,uVar12) | uVar4 & 0xc000000040000000;
        }
        else {
          if (((int)uVar15 < 0) || (nObjsMax <= (int)uVar15)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          uVar1 = *(uint *)((long)local_40 + (ulong)uVar15 * 4);
          if ((ulong)uVar1 == 0) {
            *(uint *)((long)local_40 + (ulong)uVar15 * 4) = uVar12;
          }
          else {
            if (((int)uVar1 < 0) || ((uint)p_00->nObjs <= uVar1)) goto LAB_00858102;
            *(uint *)(&pGVar3->field_0x0 + lVar16) =
                 ((uVar14 ^ *(uint *)(p_00->pObjs + uVar1)) >> 0x1d & 1) + uVar1 * 2;
            uVar4 = *(ulong *)pGVar5;
            if ((((int)(uint)uVar4 < 0) || (uVar14 = (uint)uVar4 & 0x1fffffff, uVar14 == 0x1fffffff)
                ) || (uVar14 != ((uint)(uVar4 >> 0x20) & 0x1fffffff))) goto LAB_0085815f;
            if (uVar6 < 2) goto LAB_0085817e;
            *(ulong *)pGVar5 =
                 CONCAT44(uVar12,uVar12) & 0x1fffffff1fffffff | uVar4 & 0xc000000040000000;
          }
        }
      }
      lVar13 = lVar13 + 1;
      lVar16 = lVar16 + 0xc;
    } while (lVar13 < p->nObjs);
  }
  Gia_ManHashStop(p_00);
  Gia_ManSetRegNum(p_00,p->nRegs);
  pGVar11 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  if (local_40 != (void *)0x0) {
    free(local_40);
  }
  return pGVar11;
}

Assistant:

Gia_Man_t * Gia_ManSweepHierarchy( Gia_Man_t * p )
{
    Vec_Int_t * vMap = Vec_IntStart( Gia_ManObjNum(p) );
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pObjNew, * pObjNewR;
    int i, iFanin, CountReals[2] = {0};

    // duplicate AIG while propagating constants and equivalences 
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsBuf(pObj) )
        {
            pObj->Value = Gia_ManAppendBuf( pNew, Gia_ObjFanin0Copy(pObj) );
            pObjNew = Gia_ManObj( pNew, Abc_Lit2Var(pObj->Value) );
            iFanin = Gia_ObjFaninId0p( pNew, pObjNew );
            if ( iFanin == 0 )
            {
                pObj->Value = Gia_ObjFaninC0(pObjNew);
                CountReals[0]++;
                Gia_ManPatchBufDriver( pNew, Gia_ObjId(pNew, pObjNew), 0 );
            }
            else if ( Vec_IntEntry(vMap, iFanin) )
            {
                pObjNewR = Gia_ManObj( pNew, Vec_IntEntry(vMap, iFanin) );
                pObj->Value = Abc_Var2Lit( Vec_IntEntry(vMap, iFanin), Gia_ObjFaninC0(pObjNewR) ^ Gia_ObjFaninC0(pObjNew) );
                CountReals[1]++;
                Gia_ManPatchBufDriver( pNew, Gia_ObjId(pNew, pObjNew), 0 );
            }
            else
                Vec_IntWriteEntry( vMap, iFanin, Gia_ObjId(pNew, pObjNew) );
        }
        else if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Gia_ManAppendCi( pNew );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    }
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
//    printf( "Updated %d const and %d shared.\n", CountReals[0], CountReals[1] );
    Vec_IntFree( vMap );
    return pNew;
}